

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

size_t derTDec(u32 *tag,octet *der,size_t count)

{
  byte *pbVar1;
  byte bVar2;
  ulong uVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  
  sVar5 = 0xffffffffffffffff;
  if (count != 0) {
    sVar6 = 4;
    if (count < 4) {
      sVar6 = count;
    }
    bVar2 = *der;
    uVar4 = (uint)bVar2;
    if ((~bVar2 & 0x1f) == 0) {
      if ((count == 1) || (uVar7 = 0, (der[1] & 0x7f) == 0)) {
        return 0;
      }
      sVar5 = 1;
      do {
        if (sVar6 == sVar5) {
          return 0xffffffffffffffff;
        }
        pbVar1 = der + sVar5;
        uVar7 = *pbVar1 & 0x7f | uVar7 << 8;
        sVar5 = sVar5 + 1;
      } while ((char)*pbVar1 < '\0');
      if (sVar6 == sVar5) {
        return 0xffffffffffffffff;
      }
      if (uVar7 < 0x1f) {
        return 0xffffffffffffffff;
      }
    }
    else {
      if (bVar2 == 0) {
        return 0xffffffffffffffff;
      }
      sVar5 = 1;
    }
    if (tag != (u32 *)0x0) {
      for (uVar3 = 1; uVar3 < sVar5; uVar3 = uVar3 + 1) {
        uVar4 = uVar4 << 8 | (uint)der[uVar3];
      }
      *tag = uVar4;
    }
  }
  return sVar5;
}

Assistant:

static size_t derTDec(u32* tag, const octet der[], size_t count)
{
	u32 t;
	size_t t_count = 1;
	// обработать длину кода
	if (count < 1)
		return SIZE_MAX;
	ASSERT(memIsValid(der, count));
	count = MIN2(4, count);
	// длинный код?
	if ((der[0] & 31) == 31)
	{
		// короткий код? лишний октет с нулем?
		if (count < 2 || (der[1] & 127) == 0)
			return FALSE;
		for (t = 0; t_count < count;)
		{
			t <<= 8, t |= der[t_count] & 127;
			// завершающий октет?
			if ((der[t_count++] & 128) == 0)
				break;
		}
		// завершающий октет не найден?
		// можно было обойтись коротким кодом?
		if (t_count == count || t < 31)
			return SIZE_MAX;
	}
	// нулевой тег?
	else if (der[0] == 0)
		return SIZE_MAX;
	// возврат 
	if (tag)
	{
		size_t pos;
		ASSERT(memIsValid(tag, 4));
		for (t = der[0], pos = 1; pos < t_count; ++pos)
			t <<= 8, t |= der[pos];
		*tag = t;		
	}
	return t_count;
}